

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_get_table(sqlite3 *db,char *zSql,char ***pazResult,int *pnRow,int *pnColumn,
                     char **pzErrMsg)

{
  int iVar1;
  char *pcVar2;
  ulong *puVar3;
  ulong uVar4;
  TabResult res;
  ulong *local_58;
  void *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  
  *pazResult = (char **)0x0;
  if (pnColumn != (int *)0x0) {
    *pnColumn = 0;
  }
  if (pnRow != (int *)0x0) {
    *pnRow = 0;
  }
  if (pzErrMsg != (char **)0x0) {
    *pzErrMsg = (char *)0x0;
  }
  local_50 = (void *)0x0;
  local_48 = 0x14;
  uStack_40 = 0x100000000;
  local_38 = 0;
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    local_58 = (ulong *)sqlite3Malloc(0xa0);
  }
  else {
    local_58 = (ulong *)0x0;
  }
  if (local_58 == (ulong *)0x0) {
    db->errCode = 7;
LAB_0013cd3a:
    iVar1 = 7;
  }
  else {
    *local_58 = 0;
    iVar1 = sqlite3_exec(db,zSql,sqlite3_get_table_cb,&local_58,pzErrMsg);
    *local_58 = uStack_40 >> 0x20;
    if ((char)iVar1 == '\x04') {
      sqlite3_free_table((char **)(local_58 + 1));
      if (local_50 != (void *)0x0) {
        if (pzErrMsg != (char **)0x0) {
          sqlite3_free(*pzErrMsg);
          pcVar2 = sqlite3_mprintf("%s",local_50);
          *pzErrMsg = pcVar2;
        }
        sqlite3_free(local_50);
      }
      db->errCode = local_38;
      return local_38;
    }
    sqlite3_free(local_50);
    puVar3 = local_58;
    if (iVar1 != 0) {
      sqlite3_free_table((char **)(local_58 + 1));
      return iVar1;
    }
    uVar4 = (ulong)uStack_40._4_4_;
    if (uStack_40._4_4_ < (uint)local_48) {
      iVar1 = sqlite3_initialize();
      if (iVar1 == 0) {
        puVar3 = (ulong *)sqlite3Realloc(puVar3,uVar4 << 3);
      }
      else {
        puVar3 = (ulong *)0x0;
      }
      if (puVar3 == (ulong *)0x0) {
        sqlite3_free_table((char **)(local_58 + 1));
        db->errCode = 7;
        goto LAB_0013cd3a;
      }
    }
    local_58 = puVar3;
    *pazResult = (char **)(local_58 + 1);
    if (pnColumn != (int *)0x0) {
      *pnColumn = (int)uStack_40;
    }
    iVar1 = 0;
    if (pnRow != (int *)0x0) {
      *pnRow = local_48._4_4_;
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_get_table(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  char ***pazResult,          /* Write the result table here */
  int *pnRow,                 /* Write the number of rows in the result here */
  int *pnColumn,              /* Write the number of columns of result here */
  char **pzErrMsg             /* Write error messages here */
){
  int rc;
  TabResult res;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pazResult==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *pazResult = 0;
  if( pnColumn ) *pnColumn = 0;
  if( pnRow ) *pnRow = 0;
  if( pzErrMsg ) *pzErrMsg = 0;
  res.zErrMsg = 0;
  res.nRow = 0;
  res.nColumn = 0;
  res.nData = 1;
  res.nAlloc = 20;
  res.rc = SQLITE_OK;
  res.azResult = sqlite3_malloc64(sizeof(char*)*res.nAlloc );
  if( res.azResult==0 ){
     db->errCode = SQLITE_NOMEM;
     return SQLITE_NOMEM_BKPT;
  }
  res.azResult[0] = 0;
  rc = sqlite3_exec(db, zSql, sqlite3_get_table_cb, &res, pzErrMsg);
  assert( sizeof(res.azResult[0])>= sizeof(res.nData) );
  res.azResult[0] = SQLITE_INT_TO_PTR(res.nData);
  if( (rc&0xff)==SQLITE_ABORT ){
    sqlite3_free_table(&res.azResult[1]);
    if( res.zErrMsg ){
      if( pzErrMsg ){
        sqlite3_free(*pzErrMsg);
        *pzErrMsg = sqlite3_mprintf("%s",res.zErrMsg);
      }
      sqlite3_free(res.zErrMsg);
    }
    db->errCode = res.rc;  /* Assume 32-bit assignment is atomic */
    return res.rc;
  }
  sqlite3_free(res.zErrMsg);
  if( rc!=SQLITE_OK ){
    sqlite3_free_table(&res.azResult[1]);
    return rc;
  }
  if( res.nAlloc>res.nData ){
    char **azNew;
    azNew = sqlite3_realloc64( res.azResult, sizeof(char*)*res.nData );
    if( azNew==0 ){
      sqlite3_free_table(&res.azResult[1]);
      db->errCode = SQLITE_NOMEM;
      return SQLITE_NOMEM_BKPT;
    }
    res.azResult = azNew;
  }
  *pazResult = &res.azResult[1];
  if( pnColumn ) *pnColumn = res.nColumn;
  if( pnRow ) *pnRow = res.nRow;
  return rc;
}